

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gain_calculator_direct_speakers.cpp
# Opt level: O3

bool __thiscall
ear::GainCalculatorDirectSpeakersImpl::_isLfeChannel
          (GainCalculatorDirectSpeakersImpl *this,DirectSpeakersTypeMetadata *metadata,
          WarningCB *warning_cb)

{
  pointer pcVar1;
  long *plVar2;
  byte bVar3;
  uint uVar4;
  int iVar5;
  undefined8 in_RAX;
  undefined8 uVar7;
  byte bVar8;
  pointer pbVar9;
  long *plVar10;
  bool bVar11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> speakerLabel;
  string nominalLabel;
  undefined1 local_e0 [8];
  _Alloc_hider local_d8;
  undefined1 local_d0 [28];
  uint local_b4;
  pointer local_b0;
  string local_a8;
  long *local_88;
  size_t local_80;
  long local_78 [2];
  DirectSpeakersTypeMetadata *local_68;
  _Any_data *local_60;
  GainCalculatorDirectSpeakersImpl *local_58;
  long *local_50;
  size_t local_48;
  long local_40 [2];
  ulong uVar6;
  
  local_58 = this;
  if ((metadata->channelFrequency).lowPass.super_type.m_initialized == true) {
    if ((200.0 < (metadata->channelFrequency).lowPass.super_type.m_storage) ||
       (((metadata->channelFrequency).highPass.super_type.m_initialized & 1U) != 0)) {
LAB_0015b44c:
      local_e0._0_4_ = FREQ_NOT_LFE;
      local_d8._M_p = local_d0 + 8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_d8,
                 "frequency indication present but does not indicate an LFE channel","");
      if ((warning_cb->super__Function_base)._M_manager == (_Manager_type)0x0) {
        std::__throw_bad_function_call();
        goto LAB_0015b6ea;
      }
      (*warning_cb->_M_invoker)((_Any_data *)warning_cb,(Warning *)local_e0);
      if (local_d8._M_p != local_d0 + 8) {
        operator_delete(local_d8._M_p,local_d0._8_8_ + 1);
      }
      goto LAB_0015b4a2;
    }
    pbVar9 = (metadata->speakerLabels).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_b0 = (metadata->speakerLabels).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    uVar6 = CONCAT71((int7)((ulong)in_RAX >> 8),1);
    uVar4 = (uint)uVar6;
    if (pbVar9 != local_b0) goto LAB_0015b4c0;
    bVar8 = 0;
  }
  else {
    if ((metadata->channelFrequency).highPass.super_type.m_initialized == true) goto LAB_0015b44c;
LAB_0015b4a2:
    pbVar9 = (metadata->speakerLabels).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_b0 = (metadata->speakerLabels).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    bVar3 = 0;
    uVar4 = 0;
    bVar8 = 0;
    if (pbVar9 == local_b0) goto LAB_0015b6cf;
LAB_0015b4c0:
    bVar8 = 0;
    local_b4 = uVar4;
    local_68 = metadata;
    local_60 = (_Any_data *)warning_cb;
    do {
      local_e0 = (undefined1  [8])local_d0;
      pcVar1 = (pbVar9->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_e0,pcVar1,pcVar1 + pbVar9->_M_string_length);
      _nominalSpeakerLabel(&local_a8,local_58,(string *)local_e0);
      local_88 = local_78;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"LFE1","");
      plVar10 = local_88;
      if ((local_a8._M_string_length != local_80) ||
         ((bVar11 = true, local_a8._M_string_length != 0 &&
          (iVar5 = bcmp(local_a8._M_dataplus._M_p,local_88,local_a8._M_string_length), iVar5 != 0)))
         ) {
        local_50 = local_40;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"LFE2","");
        plVar2 = local_50;
        if (local_a8._M_string_length == local_48) {
          if (local_a8._M_string_length == 0) {
            bVar11 = true;
          }
          else {
            iVar5 = bcmp(local_a8._M_dataplus._M_p,local_50,local_a8._M_string_length);
            bVar11 = iVar5 == 0;
          }
        }
        else {
          bVar11 = false;
        }
        plVar10 = local_88;
        if (plVar2 != local_40) {
          operator_delete(plVar2,local_40[0] + 1);
          plVar10 = local_88;
        }
      }
      if (plVar10 != local_78) {
        operator_delete(plVar10,local_78[0] + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
        operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
      }
      if (local_e0 != (undefined1  [8])local_d0) {
        operator_delete((void *)local_e0,local_d0._0_8_ + 1);
      }
      bVar8 = bVar8 | bVar11;
      pbVar9 = pbVar9 + 1;
    } while (pbVar9 != local_b0);
    uVar6 = (ulong)local_b4;
    bVar3 = (byte)local_b4;
    metadata = local_68;
    warning_cb = (WarningCB *)local_60;
    if (((bVar3 ^ bVar8) & 1) == 0) goto LAB_0015b6cf;
  }
  bVar3 = (byte)uVar6;
  if ((metadata->speakerLabels).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (metadata->speakerLabels).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    local_e0._0_4_ = FREQ_SPEAKERLABEL_LFE_MISMATCH;
    local_d8._M_p = local_d0 + 8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_d8,
               "LFE indication from frequency element does not match speakerLabel","");
    if (*(long *)((long)warning_cb + 0x10) == 0) {
LAB_0015b6ea:
      uVar7 = std::__throw_bad_function_call();
      _Unwind_Resume(uVar7);
    }
    (**(code **)((long)warning_cb + 0x18))((_Any_data *)warning_cb,(Warning *)local_e0);
    if (local_d8._M_p != local_d0 + 8) {
      operator_delete(local_d8._M_p,local_d0._8_8_ + 1);
    }
  }
LAB_0015b6cf:
  return (bool)(bVar3 & 1 | bVar8);
}

Assistant:

bool GainCalculatorDirectSpeakersImpl::_isLfeChannel(
      const DirectSpeakersTypeMetadata& metadata, const WarningCB& warning_cb) {
    bool has_lfe_freq = (metadata.channelFrequency.lowPass != boost::none &&
                         metadata.channelFrequency.lowPass.get() <= 200 &&
                         metadata.channelFrequency.highPass == boost::none);
    if (!has_lfe_freq && (metadata.channelFrequency.lowPass ||
                          metadata.channelFrequency.highPass))
      warning_cb({Warning::Code::FREQ_NOT_LFE,
                  "frequency indication present but does "
                  "not indicate an LFE channel"});

    bool has_lfe_name = false;
    for (auto speakerLabel : metadata.speakerLabels) {
      std::string nominalLabel = _nominalSpeakerLabel(speakerLabel);
      if (nominalLabel == std::string("LFE1") ||
          nominalLabel == std::string("LFE2")) {
        has_lfe_name = true;
      }
    }

    if (has_lfe_freq != has_lfe_name && metadata.speakerLabels.size())
      warning_cb({Warning::Code::FREQ_SPEAKERLABEL_LFE_MISMATCH,
                  "LFE indication from frequency element does not match "
                  "speakerLabel"});

    return has_lfe_freq || has_lfe_name;
  }